

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_shared_mutex.hpp
# Opt level: O3

void __thiscall
yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::unlock
          (shared_mutex_base<yamc::rwlock::ReaderPrefer> *this)

{
  ulong uVar1;
  int iVar2;
  id tid;
  system_error *this_00;
  error_category *peVar3;
  error_code __ec;
  
  tid._M_thread = pthread_self();
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx_);
  if (iVar2 == 0) {
    if ((this->e_owner_)._M_thread == tid._M_thread) {
      (this->e_owner_)._M_thread = 0;
      uVar1 = (this->state_).rwcount;
      if ((long)uVar1 < 0) {
        (this->state_).rwcount = uVar1 & 0x7fffffffffffffff;
        validator::deadlock::unlocked((uintptr_t)this,tid,false);
        std::condition_variable::notify_all();
        pthread_mutex_unlock((pthread_mutex_t *)&this->mtx_);
        return;
      }
      __assert_fail("s.rwcount & writer_mask",
                    "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/include/yamc_rwlock_sched.hpp"
                    ,0x50,"static void yamc::rwlock::ReaderPrefer::release_wlock(state &)");
    }
  }
  else {
    std::__throw_system_error(iVar2);
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  peVar3 = (error_category *)std::_V2::generic_category();
  __ec._M_cat = peVar3;
  __ec._0_8_ = 1;
  std::system_error::system_error(this_00,__ec,"invalid unlock");
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void unlock()
  {
    const auto tid = std::this_thread::get_id();
    std::lock_guard<decltype(mtx_)> lk(mtx_);
    if (e_owner_ != tid) {
      // owner thread
#if YAMC_CHECKED_CALL_ABORT
      std::abort();
#else
      throw std::system_error(std::make_error_code(std::errc::operation_not_permitted), "invalid unlock");
#endif
    }
    e_owner_ = {};
    RwLockPolicy::release_wlock(state_);
    validator::unlocked(reinterpret_cast<uintptr_t>(this), tid, false);
    cv_.notify_all();
  }